

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  IMAP *pIVar1;
  connectdata *conn;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  ulong uVar4;
  
  pIVar1 = (data->req).p.imap;
  if (pIVar1 == (IMAP *)0x0) {
    CVar3 = CURLE_OK;
  }
  else {
    conn = data->conn;
    (*Curl_cfree)(pIVar1->mailbox);
    pIVar1->mailbox = (char *)0x0;
    if (status == CURLE_OK) {
      uVar4 = 0;
      if (((((data->set).connect_only == '\0') && ((data->set).mail_rcpt != (curl_slist *)0x0)) &&
          ((uVar4 = 0, ((data->state).field_0x746 & 2) != 0 ||
           ((data->set).mimepost.kind != MIMEKIND_NONE)))) &&
         (smtp_state(data,SMTP_POSTDATA), (conn->proto).smtpc.state != SMTP_STOP)) {
        do {
          CVar3 = Curl_pp_statemach(data,&(conn->proto).ftpc.pp,true,false);
          uVar4 = (ulong)CVar3;
          if ((conn->proto).smtpc.state == SMTP_STOP) break;
        } while (CVar3 == CURLE_OK);
      }
    }
    else {
      Curl_conncontrol(conn,1);
      uVar4 = (ulong)status;
    }
    CVar3 = (CURLcode)uVar4;
    pIVar1->transfer = PPTRANSFER_BODY;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)) &&
        (0 < Curl_trc_feat_smtp.log_level)))) {
      Curl_trc_smtp(data,"smtp_done(status=%d, premature=%d) -> %d",(ulong)status,premature,uVar4);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode smtp_done(struct Curl_easy *data, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct SMTP *smtp = data->req.p.smtp;

  (void)premature;

  if(!smtp)
    return CURLE_OK;

  /* Cleanup our per-request based variables */
  Curl_safefree(smtp->custom);

  if(status) {
    connclose(conn, "SMTP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && data->set.mail_rcpt &&
          (data->state.upload || IS_MIME_POST(data))) {

    smtp_state(data, SMTP_POSTDATA);

    /* Run the state-machine */
    result = smtp_block_statemach(data, conn, FALSE);
  }

  /* Clear the transfer mode for the next request */
  smtp->transfer = PPTRANSFER_BODY;
  CURL_TRC_SMTP(data, "smtp_done(status=%d, premature=%d) -> %d",
                status, premature, result);
  return result;
}